

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  TValue *key;
  int iVar2;
  undefined4 uVar3;
  TValue *t;
  TValue *slot;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_getint((Table *)(t->value_).gc,n);
    if (slot->tt_ != 0) {
      pTVar1 = L->top;
      iVar2 = slot->tt_;
      uVar3 = *(undefined4 *)&slot->field_0xc;
      pTVar1->value_ = slot->value_;
      pTVar1->tt_ = iVar2;
      *(undefined4 *)&pTVar1->field_0xc = uVar3;
      L->top = L->top + 1;
      goto LAB_0010f45a;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).i = n;
  pTVar1->tt_ = 0x13;
  key = L->top;
  L->top = key + 1;
  luaV_finishget(L,t,key,key,slot);
LAB_0010f45a:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  t = index2addr(L, idx);
  if (luaV_fastget(L, t, n, slot, luaH_getint)) {
    setobj2s(L, L->top, slot);
    api_incr_top(L);
  }
  else {
    setivalue(L->top, n);
    api_incr_top(L);
    luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}